

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O0

error_t ArgumentHandlers::jpolIndex_parse_argument(int key,char *arg,argp_state *state)

{
  ulonglong uVar1;
  ostream *poVar2;
  E *this;
  stringstream *arg_00;
  long in_RDX;
  char *in_RSI;
  int in_EDI;
  stringstream ss;
  char *left;
  Arguments *theArgumentsStruc;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  char *local_28;
  long local_20;
  char *local_10;
  error_t local_4;
  
  if (jpolIndex_parse_argument::got_jpolIndex) {
    local_4 = 7;
  }
  else {
    local_20 = *(long *)(in_RDX + 0x28);
    if (in_EDI == 0) {
      local_10 = in_RSI;
      uVar1 = strtoull(in_RSI,&local_28,10);
      *(ulonglong *)(local_20 + 0x88) = uVar1;
      if (*local_28 != '\0') {
        std::__cxx11::stringstream::stringstream(local_1b0);
        poVar2 = std::operator<<(local_1a0,"Could not entirely parse the JPOL-INDEX: arg=\'");
        poVar2 = std::operator<<(poVar2,local_10);
        poVar2 = std::operator<<(poVar2,"\', left=\'");
        poVar2 = std::operator<<(poVar2,local_28);
        poVar2 = std::operator<<(poVar2,"\', found jpol index=\'");
        this = (E *)std::ostream::operator<<(poVar2,*(ulonglong *)(local_20 + 0x88));
        std::operator<<((ostream *)this,"\'");
        arg_00 = (stringstream *)__cxa_allocate_exception(0x28);
        E::E(this,arg_00);
        __cxa_throw(arg_00,&E::typeinfo,E::~E);
      }
      jpolIndex_parse_argument::got_jpolIndex = true;
    }
    else {
      if (in_EDI != 0x1000002) {
        return 7;
      }
      argp_usage(in_RDX);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

error_t
jpolIndex_parse_argument (int key, char *arg, struct argp_state *state)
{
    static bool got_jpolIndex = 0;
    //if we already got the dec-pomdp file return
    if(got_jpolIndex)
        return ARGP_ERR_UNKNOWN;
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
        case ARGP_KEY_NO_ARGS:
            argp_usage (state);
            break;
        case ARGP_KEY_ARG:
        {
            char *left;
#if USE_ARBITRARY_PRECISION_INDEX
            theArgumentsStruc->jpolIndex = arg;
#else
            theArgumentsStruc->jpolIndex = strtoull(arg,&left,10);
            if(*left != '\0')
            {
                std::stringstream ss;
                ss << "Could not entirely parse the JPOL-INDEX: arg='"
                   << arg <<"', left='" << left
                   << "', found jpol index='"<< theArgumentsStruc->jpolIndex
                   << "'";
                throw(E(ss));
            }
#endif
            got_jpolIndex = 1;
            break;
        }
        default:
            return ARGP_ERR_UNKNOWN;
     }
    return 0;
}